

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astar.hpp
# Opt level: O0

int __thiscall
astar::AStar::MoveCast(AStar *this,Point *start,Point *end,int horCost,int verCost,int diaCost)

{
  int iVar1;
  int iVar2;
  int local_38;
  int cost;
  int dy;
  int dx;
  int diaCost_local;
  int verCost_local;
  int horCost_local;
  Point *end_local;
  Point *start_local;
  AStar *this_local;
  
  iVar1 = start->x - end->x;
  if (iVar1 < 1) {
    iVar1 = -iVar1;
  }
  iVar2 = start->y - end->y;
  if (iVar2 < 1) {
    iVar2 = -iVar2;
  }
  local_38 = 0;
  if (this->moveType == D4) {
    local_38 = iVar1 * horCost + iVar2 * verCost;
  }
  else if (this->moveType == D8) {
    if (iVar2 < iVar1) {
      local_38 = horCost * (iVar1 - iVar2) + diaCost * iVar2;
    }
    else {
      local_38 = verCost * (iVar2 - iVar1) + diaCost * iVar1;
    }
  }
  return local_38;
}

Assistant:

int AStar::MoveCast(const Point& start, const Point& end, int horCost, int verCost, int diaCost)
{
    int dx = std::labs(start.x - end.x);
    int dy = std::labs(start.y - end.y);
    int cost = 0;
    if (moveType == D4) {
        cost = dx * horCost + dy * verCost;
    }
    else if (moveType == D8) {
        if (dx > dy) {
            cost = horCost * (dx - dy) + diaCost * dy;
        }
        else {
            cost = verCost * (dy - dx) + diaCost * dx;
        }
    }
    return cost;
}